

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O0

void __thiscall crnlib::dynamic_string::optimize(dynamic_string *this)

{
  uint32 uVar1;
  char *__dest;
  dynamic_string *in_RDI;
  char *p;
  uint min_buf_size;
  undefined8 in_stack_ffffffffffffffe8;
  uint32 num;
  
  num = (uint32)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
  if (in_RDI->m_len == 0) {
    clear(in_RDI);
  }
  else {
    uVar1 = math::next_pow2(in_RDI->m_len + 1);
    if (uVar1 < in_RDI->m_buf_size) {
      __dest = crnlib_new_array<char>(num);
      memcpy(__dest,in_RDI->m_pStr,(long)(int)(in_RDI->m_len + 1));
      crnlib_delete_array<char>((char *)in_RDI);
      in_RDI->m_pStr = __dest;
      in_RDI->m_buf_size = (uint16)uVar1;
      check(in_RDI);
    }
  }
  return;
}

Assistant:

void dynamic_string::optimize() {
  if (!m_len)
    clear();
  else {
    uint min_buf_size = math::next_pow2((uint)m_len + 1);
    if (m_buf_size > min_buf_size) {
      char* p = crnlib_new_array<char>(min_buf_size);
      memcpy(p, m_pStr, m_len + 1);

      crnlib_delete_array(m_pStr);
      m_pStr = p;

      m_buf_size = static_cast<uint16>(min_buf_size);

      check();
    }
  }
}